

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_20de8f::NullBackend::mixerProc(NullBackend *this)

{
  bool bVar1;
  type __rtime;
  rep rVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RDI;
  seconds s;
  int64_t avail;
  time_point now;
  time_point start;
  int64_t done;
  milliseconds restTime;
  size_t in_stack_000000a8;
  ALuint in_stack_000000b4;
  void *in_stack_000000b8;
  ALCdevice *in_stack_000000c0;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff78;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff80;
  uint7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  long local_60;
  duration<long,_std::ratio<1L,_1L>_> local_58;
  duration<long,_std::ratio<1L,_1L>_> local_40;
  rep local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  uint local_14;
  duration<long,std::ratio<1l,1000l>> local_10 [16];
  
  local_14 = (uint)((ulong)(uint)(*(int *)(in_RDI[1].__r + 0x10) * 1000) /
                    (ulong)*(uint *)(in_RDI[1].__r + 0xc) >> 1);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_int,void>(local_10,&local_14);
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  local_20 = 0;
  local_28 = std::chrono::_V2::steady_clock::now();
  while( true ) {
    bVar1 = std::atomic<bool>::load
                      ((atomic<bool> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)
                       ,(memory_order)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    in_stack_ffffffffffffff8f = false;
    if (!bVar1) {
      in_stack_ffffffffffffff8f =
           std::atomic<bool>::load
                     ((atomic<bool> *)(ulong)in_stack_ffffffffffffff88,
                      (memory_order)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    }
    if ((bool)in_stack_ffffffffffffff8f == false) break;
    local_30 = std::chrono::_V2::steady_clock::now();
    __rtime = std::chrono::operator-
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff80);
    std::chrono::operator*
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
               (uint *)in_stack_ffffffffffffff80);
    local_40.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_ffffffffffffff78);
    local_38 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_40);
    if (local_38 - local_20 < (long)(ulong)*(uint *)(in_RDI[1].__r + 0x10)) {
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)__rtime.__r);
    }
    else {
      for (; (long)(ulong)*(uint *)(in_RDI[1].__r + 0x10) <= local_38 - local_20;
          local_20 = (ulong)*(uint *)(in_RDI[1].__r + 0x10) + local_20) {
        ALCdevice::renderSamples
                  (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000a8);
      }
      if ((long)(ulong)*(uint *)(in_RDI[1].__r + 0xc) <= local_20) {
        local_60 = local_20 / (long)(ulong)*(uint *)(in_RDI[1].__r + 0xc);
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
                  ((duration<long,std::ratio<1l,1l>> *)&local_58,&local_60);
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::
        duration<long,std::ratio<1l,1l>,void>
                  (in_RDI,(duration<long,_std::ratio<1L,_1L>_> *)
                          CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::operator+=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        in_stack_ffffffffffffff80 =
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)(ulong)*(uint *)(in_RDI[1].__r + 0xc);
        rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_58);
        local_20 = local_20 - (long)in_stack_ffffffffffffff80 * rVar2;
      }
    }
  }
  return 0;
}

Assistant:

int NullBackend::mixerProc()
{
    const milliseconds restTime{mDevice->UpdateSize*1000/mDevice->Frequency / 2};

    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    int64_t done{0};
    auto start = std::chrono::steady_clock::now();
    while(!mKillNow.load(std::memory_order_acquire)
        && mDevice->Connected.load(std::memory_order_acquire))
    {
        auto now = std::chrono::steady_clock::now();

        /* This converts from nanoseconds to nanosamples, then to samples. */
        int64_t avail{std::chrono::duration_cast<seconds>((now-start) * mDevice->Frequency).count()};
        if(avail-done < mDevice->UpdateSize)
        {
            std::this_thread::sleep_for(restTime);
            continue;
        }
        while(avail-done >= mDevice->UpdateSize)
        {
            mDevice->renderSamples(nullptr, mDevice->UpdateSize, 0u);
            done += mDevice->UpdateSize;
        }

        /* For every completed second, increment the start time and reduce the
         * samples done. This prevents the difference between the start time
         * and current time from growing too large, while maintaining the
         * correct number of samples to render.
         */
        if(done >= mDevice->Frequency)
        {
            seconds s{done/mDevice->Frequency};
            start += s;
            done -= mDevice->Frequency*s.count();
        }
    }

    return 0;
}